

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O0

float __thiscall embree::Token::Float(Token *this,bool cast)

{
  runtime_error *this_00;
  byte in_SIL;
  int *in_RDI;
  ParseLocation *in_stack_00000038;
  undefined3 in_stack_ffffffffffffff98;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff9c;
  string local_38 [39];
  byte local_11;
  float local_4;
  
  local_11 = in_SIL & 1;
  if (*in_RDI == 3) {
    local_4 = (float)in_RDI[1];
  }
  else {
    if ((*in_RDI != 2) || (local_11 == 0)) {
      uVar1 = CONCAT13(1,in_stack_ffffffffffffff98);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_(in_stack_00000038);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff9c,uVar1),(char *)in_RDI);
      std::runtime_error::runtime_error(this_00,local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = (float)in_RDI[1];
  }
  return local_4;
}

Assistant:

float Float(bool cast = true)  const {
      if (ty == TY_FLOAT) return f;
      if (ty == TY_INT && cast) return (float)i;
      THROW_RUNTIME_ERROR(loc.str()+": float expected");
    }